

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

TableViewCell * __thiscall
QtMWidgets::TableViewSection::removeCell(TableViewSection *this,int index)

{
  TableViewSectionPrivate *pTVar1;
  TableViewCell *pTVar2;
  RowsSeparator *pRVar3;
  ulong i;
  
  if (-1 < index) {
    i = (ulong)(uint)index;
    pTVar1 = (this->d).d;
    if ((long)i < (pTVar1->cells).d.size) {
      pTVar2 = (pTVar1->cells).d.ptr[i];
      if (index != 0) {
        pRVar3 = (pTVar1->separators).d.ptr[index - 1];
        QLayout::removeWidget((QWidget *)pTVar1->layout);
        QList<QtMWidgets::RowsSeparator_*>::removeAt(&((this->d).d)->separators,(ulong)(index - 1));
        if (pRVar3 != (RowsSeparator *)0x0) {
          (**(code **)(*(long *)pRVar3 + 0x20))(pRVar3);
        }
      }
      QLayout::removeWidget((QWidget *)((this->d).d)->layout);
      QWidget::setParent(&pTVar2->super_QWidget);
      QWidget::hide();
      QList<QtMWidgets::TableViewCell_*>::removeAt(&((this->d).d)->cells,i);
      QWidget::adjustSize();
      return pTVar2;
    }
  }
  return (TableViewCell *)0x0;
}

Assistant:

TableViewCell *
TableViewSection::removeCell( int index )
{
	if( index >= 0 && index < d->cells.size() )
	{
		TableViewCell * cell = d->cells.at( index );

		if( index != 0 )
		{
			RowsSeparator * s = d->separators.at( index - 1 );
			d->layout->removeWidget( s );
			d->separators.removeAt( index - 1 );
			delete s;
		}

		d->layout->removeWidget( cell );
		cell->setParent( 0 );
		cell->hide();

		d->cells.removeAt( index );

		adjustSize();

		return cell;
	}
	else
		return 0;
}